

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Disk * pbrt::Disk::Create(Transform *renderFromObject,Transform *objectFromRender,
                         bool reverseOrientation,ParameterDictionary *parameters,FileLoc *loc,
                         Allocator alloc)

{
  Disk *pDVar1;
  Float FVar2;
  bool reverseOrientation_local;
  allocator<char> local_65;
  Float radius;
  string local_60;
  Float phimax;
  Float innerRadius;
  Float height;
  Transform *objectFromRender_local;
  Transform *renderFromObject_local;
  Allocator alloc_local;
  
  reverseOrientation_local = reverseOrientation;
  objectFromRender_local = objectFromRender;
  renderFromObject_local = renderFromObject;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"height",(allocator<char> *)&radius);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,0.0);
  std::__cxx11::string::~string((string *)&local_60);
  height = FVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"radius",(allocator<char> *)&innerRadius);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,1.0);
  std::__cxx11::string::~string((string *)&local_60);
  radius = FVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"innerradius",(allocator<char> *)&phimax);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,0.0);
  std::__cxx11::string::~string((string *)&local_60);
  innerRadius = FVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"phimax",&local_65);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,360.0);
  std::__cxx11::string::~string((string *)&local_60);
  phimax = FVar2;
  pDVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::Disk,pbrt::Transform_const*&,pbrt::Transform_const*&,bool&,float&,float&,float&,float&>
                     (&alloc_local,&renderFromObject_local,&objectFromRender_local,
                      &reverseOrientation_local,&height,&radius,(float *)&innerRadius,
                      (float *)&phimax);
  return pDVar1;
}

Assistant:

Disk *Disk::Create(const Transform *renderFromObject, const Transform *objectFromRender,
                   bool reverseOrientation, const ParameterDictionary &parameters,
                   const FileLoc *loc, Allocator alloc) {
    Float height = parameters.GetOneFloat("height", 0.);
    Float radius = parameters.GetOneFloat("radius", 1);
    Float innerRadius = parameters.GetOneFloat("innerradius", 0);
    Float phimax = parameters.GetOneFloat("phimax", 360);
    return alloc.new_object<Disk>(renderFromObject, objectFromRender, reverseOrientation,
                                  height, radius, innerRadius, phimax);
}